

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::ListOp<unsigned_long>::~ListOp(ListOp<unsigned_long> *this)

{
  ListOp<unsigned_long> *this_local;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->ordered_items);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->deleted_items);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->appended_items);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->prepended_items);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->added_items);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->explicit_items);
  return;
}

Assistant:

ListOp() : is_explicit(false) {}